

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintTupleTo<std::tuple<ot::commissioner::JoinerType,std::__cxx11::string_const&,std::__cxx11::string_const&>,2ul>
               (tuple<ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *t,ostream *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  ostream *os_local;
  tuple<ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *t_local;
  
  PrintTupleTo<std::tuple<ot::commissioner::JoinerType,std::__cxx11::string_const&,std::__cxx11::string_const&>,1ul>
            (t,param_2);
  std::operator<<(param_2,", ");
  value = std::
          get<1ul,ot::commissioner::JoinerType,std::__cxx11::string_const&,std::__cxx11::string_const&>
                    (t);
  UniversalPrinter<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::Print(value,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}